

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(int lhs,SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  rhs)

{
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar1;
  bool bVar2;
  int iVar3;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> in_ESI;
  int in_EDI;
  int ret;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> result;
  uint in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int iVar4;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_00;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffff0;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_4;
  
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )&stack0xfffffffffffffff0);
  lhs_00.m_int = in_ESI.m_int;
  bVar2 = DivisionCornerCaseHelper<int,_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
          ::DivisionCornerCase1
                    (in_EDI,in_ESI,
                     (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)&stack0xfffffffffffffff0);
  SVar1.m_int = in_stack_fffffffffffffff0.m_int;
  if ((!bVar2) &&
     (bVar2 = DivisionCornerCaseHelper2<int,_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
              ::DivisionCornerCase2
                        (lhs_00.m_int,in_stack_fffffffffffffff0,
                         (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)),
     SVar1.m_int = in_stack_fffffffffffffff0.m_int, !bVar2)) {
    iVar4 = 0;
    iVar3 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)(ulong)in_stack_ffffffffffffffe0);
    DivisionHelper<int,int,5>::
    DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              ((int *)CONCAT44(in_EDI,in_stack_fffffffffffffff0.m_int),
               (int *)CONCAT44(lhs_00.m_int,in_ESI.m_int),(int *)CONCAT44(iVar4,iVar3));
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_4,(int *)&stack0xffffffffffffffe4);
    SVar1.m_int = local_4.m_int;
  }
  local_4.m_int = SVar1.m_int;
  return (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
         local_4.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}